

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  void *pvVar1;
  int in_EDX;
  undefined4 in_ESI;
  u64 in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (((*(int *)(in_RDI + 0x20) < 1) || (in_EDX == 0)) ||
     (*(long *)(in_RDI + 8) != *(long *)(in_RDI + 0x28))) {
    if (0 < *(int *)(in_RDI + 0x20)) {
      sqlite3DbFreeNN((sqlite3 *)CONCAT44(n,bPreserve),
                      (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    pvVar1 = sqlite3DbMallocRaw((sqlite3 *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                               );
    *(void **)(in_RDI + 0x28) = pvVar1;
  }
  else {
    if (*(long *)(in_RDI + 0x18) == 0) {
      pvVar1 = sqlite3Realloc(pMem,CONCAT44(n,bPreserve));
      *(void **)(in_RDI + 0x28) = pvVar1;
      if (*(long *)(in_RDI + 0x28) == 0) {
        sqlite3_free((void *)0x172fc9);
      }
      *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x28);
    }
    else {
      pvVar1 = sqlite3DbReallocOrFree
                         ((sqlite3 *)CONCAT44(n,bPreserve),
                          (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI);
      *(void **)(in_RDI + 0x28) = pvVar1;
      *(void **)(in_RDI + 8) = pvVar1;
    }
    in_EDX = 0;
  }
  if (*(long *)(in_RDI + 0x28) == 0) {
    sqlite3VdbeMemSetNull((Mem *)0x17303b);
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined4 *)(in_RDI + 0x20) = 0;
    iVar2 = 7;
  }
  else {
    iVar2 = sqlite3DbMallocSize((sqlite3 *)CONCAT44(in_ESI,in_EDX),(void *)0x173078);
    *(int *)(in_RDI + 0x20) = iVar2;
    if ((in_EDX != 0) && (*(long *)(in_RDI + 8) != 0)) {
      memcpy(*(void **)(in_RDI + 0x28),*(void **)(in_RDI + 8),(long)*(int *)(in_RDI + 0x10));
    }
    if ((*(ushort *)(in_RDI + 0x14) & 0x1000) != 0) {
      (**(code **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 8));
    }
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x28);
    *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0x8fff;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || (pMem->flags==MEM_Undefined
           && pMem->szMalloc<=sqlite3DbMallocSize(pMem->db,pMem->zMalloc))
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db,pMem->zMalloc));
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    if( pMem->db ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    }else{
      pMem->zMalloc = sqlite3Realloc(pMem->z, n);
      if( pMem->zMalloc==0 ) sqlite3_free(pMem->z);
      pMem->z = pMem->zMalloc;
    }
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}